

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS ref_collapse_to_remove_node1(REF_GRID ref_grid,REF_INT *actual_node0,REF_INT node1)

{
  REF_DBL *pRVar1;
  int *piVar2;
  REF_NODE ref_node;
  REF_INT *pRVar3;
  REF_GRID ref_grid_00;
  uint uVar4;
  uint uVar5;
  REF_STATUS RVar6;
  long lVar7;
  REF_GRID_STRUCT *pRVar8;
  ulong uVar9;
  ulong uVar10;
  REF_BOOL allowed;
  REF_CAVITY ref_cavity;
  REF_INT nnode;
  REF_BOOL have_geometry_support;
  REF_BOOL allowed_cavity_ratio;
  REF_BOOL local;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_INT node_to_collapse [1000];
  REF_INT order [1000];
  REF_DBL ratio_to_collapse [1000];
  uint local_3f08;
  int local_3f04;
  REF_CAVITY local_3f00;
  REF_GRID local_3ef8;
  int local_3ef0;
  int local_3eec;
  int local_3ee8;
  int local_3ee4;
  REF_NODE local_3ee0;
  uint *local_3ed8;
  ulong local_3ed0;
  double local_3ec8;
  REF_GRID_STRUCT local_3ec0 [14];
  REF_INT local_2f18 [1000];
  REF_GRID_STRUCT local_1f78 [29];
  
  ref_node = ref_grid->node;
  local_3f00 = (REF_CAVITY)0x0;
  *actual_node0 = -1;
  if (((node1 < 0) || (ref_node->max <= node1)) ||
     (uVar9 = (ulong)(uint)node1, ref_node->global[uVar9] < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0xb4
           ,"ref_collapse_to_remove_node1","node1 is invalid");
    uVar4 = 1;
  }
  else {
    lVar7 = 0x28;
    if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
      lVar7 = 0x50;
    }
    uVar4 = ref_cell_node_list_around
                      (*(REF_CELL *)((long)ref_grid->cell + lVar7 + -0x10),node1,1000,&local_3ef0,
                       (REF_INT *)&local_3ec0[0].node);
    uVar10 = (ulong)uVar4;
    if (uVar4 == 0) {
      local_3f08 = 0;
      local_3ef8 = ref_grid;
      local_3ed8 = (uint *)actual_node0;
      local_3ed0 = uVar9;
      if (0 < local_3ef0) {
        pRVar8 = local_1f78;
        lVar7 = 0;
        do {
          uVar4 = ref_node_ratio(ref_node,*(REF_INT *)((long)local_3ec0[0].cell + lVar7 * 4 + -8),
                                 node1,(REF_DBL *)pRVar8);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0xc2,"ref_collapse_to_remove_node1",(ulong)uVar4,"ratio");
            uVar10 = (ulong)uVar4;
          }
          local_3f08 = (uint)uVar10;
          if (uVar4 != 0) {
            return local_3f08;
          }
          lVar7 = lVar7 + 1;
          pRVar8 = (REF_GRID_STRUCT *)&pRVar8->node;
        } while (lVar7 < local_3ef0);
      }
      pRVar8 = local_1f78;
      uVar4 = ref_sort_heap_dbl(local_3ef0,(REF_DBL *)pRVar8,local_2f18);
      if (uVar4 == 0) {
        if (local_3ef0 < 1) {
LAB_001a1900:
          uVar4 = 0;
        }
        else {
          lVar7 = 0;
          local_3ee0 = ref_node;
          do {
            ref_grid_00 = local_3ef8;
            uVar4 = *(uint *)((long)local_3ec0[0].cell + (long)local_2f18[lVar7] * 4 + -8);
            ref_collapse_edge_mixed(local_3ef8,(REF_INT)pRVar8,node1,&local_3f04);
            if (local_3f04 != 0) {
              pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
              uVar5 = ref_collapse_edge_geometry(ref_grid_00,uVar4,node1,&local_3f04);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0xd8,"ref_collapse_to_remove_node1",(ulong)uVar5,"col geom");
                return uVar5;
              }
              if (local_3f04 != 0) {
                pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                uVar5 = ref_collapse_edge_manifold(ref_grid_00,uVar4,node1,&local_3f04);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                         ,0xdd,"ref_collapse_to_remove_node1",(ulong)uVar5,"col manifold");
                  return uVar5;
                }
                if (local_3f04 != 0) {
                  pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                  uVar5 = ref_collapse_edge_chord_height(ref_grid_00,uVar4,node1,&local_3f04);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                           ,0xe2,"ref_collapse_to_remove_node1",(ulong)uVar5,"col edge chord height"
                          );
                    return uVar5;
                  }
                  if (local_3f04 != 0) {
                    pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                    uVar5 = ref_collapse_edge_ratio(ref_grid_00,uVar4,node1,&local_3f04);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                             ,0xe6,"ref_collapse_to_remove_node1",(ulong)uVar5,"ratio");
                      return uVar5;
                    }
                    if (local_3f04 != 0) {
                      uVar5 = ref_geom_supported(ref_grid_00->geom,uVar4,&local_3eec);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                               ,0xec,"ref_collapse_to_remove_node1",(ulong)uVar5,"geom");
                        return uVar5;
                      }
                      pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                      uVar5 = ref_collapse_edge_normdev(ref_grid_00,uVar4,node1,&local_3f04);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                               ,0xed,"ref_collapse_to_remove_node1",(ulong)uVar5,"normdev");
                        return uVar5;
                      }
                      if (local_3f04 != 0) {
                        pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                        uVar5 = ref_collapse_edge_same_normal(ref_grid_00,uVar4,node1,&local_3f04);
                        if (uVar5 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                 ,0xf1,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                 "normal deviation");
                          return uVar5;
                        }
                        if (local_3f04 != 0) {
                          if (local_3eec == 0) {
                            pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                            uVar5 = ref_collapse_edge_same_tangent
                                              (ref_grid_00,uVar4,node1,&local_3f04);
                            if (uVar5 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                     ,0xf6,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                     "normal deviation");
                              return uVar5;
                            }
                            if (local_3f04 == 0) goto LAB_001a1788;
                          }
                          if ((local_3eec == 0) && (ref_grid_00->twod != 0)) {
                            pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                            uVar5 = ref_collapse_edge_twod_orientation
                                              (ref_grid_00,uVar4,node1,&local_3f04);
                            if (uVar5 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                     ,0xfc,"ref_collapse_to_remove_node1",(ulong)uVar5,"norm");
                              return uVar5;
                            }
                            if (local_3f04 == 0) goto LAB_001a1788;
                          }
                          pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                          uVar5 = ref_collapse_edge_tri_quality(ref_grid_00,uVar4,node1,&local_3f04)
                          ;
                          if (uVar5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                   ,0x102,"ref_collapse_to_remove_node1",(ulong)uVar5,"tri qual");
                            return uVar5;
                          }
                          if (local_3f04 != 0) {
                            uVar5 = ref_collapse_edge_tet_quality
                                              (ref_grid_00,uVar4,node1,&local_3f04);
                            if (uVar5 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                     ,0x107,"ref_collapse_to_remove_node1",(ulong)uVar5,"tet qual");
                              return uVar5;
                            }
                            pRVar8 = (REF_GRID_STRUCT *)(ulong)uVar4;
                            ref_collapse_edge_local_cell(local_3ef8,uVar4,node1,&local_3ee4);
                            if (local_3ee4 == 0) {
                              if (local_3f04 != 0) {
                                pRVar3 = local_3ee0->age;
                                piVar2 = pRVar3 + (int)uVar4;
                                *piVar2 = *piVar2 + 1;
                                piVar2 = pRVar3 + local_3ed0;
                                *piVar2 = *piVar2 + 1;
                              }
                            }
                            else {
                              if (local_3f04 != 0) {
                                *local_3ed8 = uVar4;
                                uVar5 = ref_collapse_edge(local_3ef8,uVar4,node1);
                                if (uVar5 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                         ,0x138,"ref_collapse_to_remove_node1",(ulong)uVar5,"col!");
                                  return uVar5;
                                }
                                if (local_3ef8->adapt->watch_topo != 0) {
                                  uVar5 = ref_validation_cell_face_node(local_3ef8,uVar4);
                                  if (uVar5 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                           ,0x13b,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                           "standard topo");
                                    printf("node0 %d node1 %d\n",(ulong)uVar4,(ulong)(uint)node1);
                                    local_3f08 = uVar5;
                                  }
LAB_001a18f4:
                                  if (uVar5 != 0) {
                                    return local_3f08;
                                  }
                                }
                                goto LAB_001a1900;
                              }
                              uVar5 = ref_cavity_create(&local_3f00);
                              if (uVar5 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                       ,0x114,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                       "cav create");
                                return uVar5;
                              }
                              pRVar8 = local_3ef8;
                              RVar6 = ref_cavity_form_edge_collapse
                                                (local_3f00,local_3ef8,uVar4,node1);
                              if ((RVar6 == 0) && (local_3f00->state != REF_CAVITY_INCONSISTENT)) {
                                uVar5 = ref_cavity_enlarge_visible(local_3f00);
                                if (uVar5 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                         ,0x118,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                         "enlarge");
                                  return uVar5;
                                }
                                if (local_3f00->state == REF_CAVITY_VISIBLE) {
                                  uVar5 = ref_cavity_ratio(local_3f00,&local_3ee8);
                                  if (uVar5 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                           ,0x11b,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                           "cavity ratio");
                                    return uVar5;
                                  }
                                  pRVar8 = local_3ec0;
                                  uVar5 = ref_cavity_change(local_3f00,(REF_DBL *)pRVar8,&local_3ec8
                                                           );
                                  if (uVar5 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                           ,0x11d,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                           "cavity change");
                                    return uVar5;
                                  }
                                  if ((local_3ee8 != 0) &&
                                     (pRVar1 = &local_3ef8->adapt->collapse_quality_absolute,
                                     *pRVar1 <= local_3ec8 && local_3ec8 != *pRVar1)) {
                                    *local_3ed8 = uVar4;
                                    uVar5 = ref_cavity_replace(local_3f00);
                                    if (uVar5 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                             ,0x123,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                             "cav replace");
                                      return uVar5;
                                    }
                                    uVar5 = ref_cavity_free(local_3f00);
                                    if (uVar5 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                             ,0x124,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                             "cav free");
                                      return uVar5;
                                    }
                                    local_3f00 = (REF_CAVITY)0x0;
                                    if (local_3ef8->adapt->watch_topo != 0) {
                                      uVar5 = ref_validation_cell_face_node(local_3ef8,uVar4);
                                      if (uVar5 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                               ,0x128,"ref_collapse_to_remove_node1",(ulong)uVar5,
                                               "cavity topo");
                                        local_3f08 = uVar5;
                                      }
                                      goto LAB_001a18f4;
                                    }
                                    goto LAB_001a1900;
                                  }
                                }
                                if (local_3f00->state == REF_CAVITY_PARTITION_CONSTRAINED) {
                                  pRVar3 = local_3ee0->age;
                                  piVar2 = pRVar3 + (int)uVar4;
                                  *piVar2 = *piVar2 + 1;
                                  piVar2 = pRVar3 + local_3ed0;
                                  *piVar2 = *piVar2 + 1;
                                }
                              }
                              uVar4 = ref_cavity_free(local_3f00);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                       ,0x131,"ref_collapse_to_remove_node1",(ulong)uVar4,"cav free"
                                      );
                                return uVar4;
                              }
                              local_3f00 = (REF_CAVITY)0x0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_001a1788:
            lVar7 = lVar7 + 1;
            uVar4 = 0;
          } while (lVar7 < local_3ef0);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0xc5,"ref_collapse_to_remove_node1",(ulong)uVar4,"sort lengths");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0xbe,"ref_collapse_to_remove_node1",uVar10,"da hood");
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_to_remove_node1(REF_GRID ref_grid,
                                                REF_INT *actual_node0,
                                                REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT nnode, node;
  REF_INT node_to_collapse[MAX_NODE_LIST];
  REF_INT order[MAX_NODE_LIST];
  REF_DBL ratio_to_collapse[MAX_NODE_LIST];
  REF_INT node0;
  REF_BOOL allowed, local, have_geometry_support;
  REF_CAVITY ref_cavity = (REF_CAVITY)NULL;
  REF_BOOL valid_cavity;
  REF_BOOL allowed_cavity_ratio;
  REF_DBL min_del, min_add;
  REF_BOOL audit = REF_FALSE;

  *actual_node0 = REF_EMPTY;
  RAS(ref_node_valid(ref_node, node1), "node1 is invalid");

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_cell_node_list_around(ref_cell, node1, MAX_NODE_LIST, &nnode,
                                node_to_collapse),
      "da hood");
  for (node = 0; node < nnode; node++) {
    RSS(ref_node_ratio(ref_node, node_to_collapse[node], node1,
                       &(ratio_to_collapse[node])),
        "ratio");
  }

  RSS(ref_sort_heap_dbl(nnode, ratio_to_collapse, order), "sort lengths");

  /* audit = (nnode > 0 && ratio_to_collapse[order[0]] < 0.2); */
  if (audit) {
    printf("node1 %d %f %f %f\n", node1, ref_node_xyz(ref_node, 0, node1),
           ref_node_xyz(ref_node, 1, node1), ref_node_xyz(ref_node, 2, node1));
  }

  for (node = 0; node < nnode; node++) {
    node0 = node_to_collapse[order[node]];
    if (audit)
      printf(" %d node0 %d ratio %f\n", nnode - node, node0,
             ratio_to_collapse[order[node]]);

    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    if (!allowed && audit) printf("   mixed\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    if (!allowed && audit) printf("   geom\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_manifold(ref_grid, node0, node1, &allowed),
        "col manifold");
    if (!allowed && audit) printf("   manifold\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_chord_height(ref_grid, node0, node1, &allowed),
        "col edge chord height");
    if (!allowed && audit) printf("   chord\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_ratio(ref_grid, node0, node1, &allowed), "ratio");
    if (!allowed && audit) printf("   ratio\n");
    if (!allowed) continue;

    RSS(ref_geom_supported(ref_grid_geom(ref_grid), node0,
                           &have_geometry_support),
        "geom");
    RSS(ref_collapse_edge_normdev(ref_grid, node0, node1, &allowed), "normdev");
    if (!allowed && audit) printf("   normdev\n");
    if (!allowed) continue;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "normal deviation");
    if (!allowed && audit) printf("   same normal\n");
    if (!allowed) continue;
    if (!have_geometry_support) {
      RSS(ref_collapse_edge_same_tangent(ref_grid, node0, node1, &allowed),
          "normal deviation");
      if (!allowed && audit) printf("   same tangent\n");
      if (!allowed) continue;
    }
    if (!have_geometry_support && ref_grid_twod(ref_grid)) {
      RSS(ref_collapse_edge_twod_orientation(ref_grid, node0, node1, &allowed),
          "norm");
      if (!allowed && audit) printf("   twod orientation\n");
      if (!allowed) continue;
    }

    RSS(ref_collapse_edge_tri_quality(ref_grid, node0, node1, &allowed),
        "tri qual");
    if (!allowed && audit) printf("   tri qual\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_tet_quality(ref_grid, node0, node1, &allowed),
        "tet qual");
    if (!allowed && audit) printf("   tet qual\n");

    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &local), "colloc");
    if (!local) {
      if (allowed) {
        ref_node_age(ref_node, node0)++;
        ref_node_age(ref_node, node1)++;
      }
      continue;
    }

    if (!allowed) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      if ((REF_SUCCESS ==
           ref_cavity_form_edge_collapse(ref_cavity, ref_grid, node0, node1)) &&
          (REF_CAVITY_INCONSISTENT != ref_cavity_state(ref_cavity))) {
        RSS(ref_cavity_enlarge_visible(ref_cavity), "enlarge");
        if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
          RSS(ref_cavity_ratio(ref_cavity, &allowed_cavity_ratio),
              "cavity ratio");
          RSS(ref_cavity_change(ref_cavity, &min_del, &min_add),
              "cavity change");
          valid_cavity =
              allowed_cavity_ratio &&
              (min_add > ref_grid_adapt(ref_grid, collapse_quality_absolute));
          if (valid_cavity) {
            *actual_node0 = node0;
            RSS(ref_cavity_replace(ref_cavity), "cav replace");
            RSS(ref_cavity_free(ref_cavity), "cav free");
            ref_cavity = (REF_CAVITY)NULL;
            if (ref_grid_adapt(ref_grid, watch_topo))
              RSS(ref_validation_cell_face_node(ref_grid, node0),
                  "cavity topo");
            return REF_SUCCESS;
          }
        }
        if (REF_CAVITY_PARTITION_CONSTRAINED == ref_cavity_state(ref_cavity)) {
          ref_node_age(ref_node, node0)++;
          ref_node_age(ref_node, node1)++;
        }
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
      ref_cavity = (REF_CAVITY)NULL;
      if (!allowed && audit) printf("   cav unsuccessful\n");
      continue;
    }

    *actual_node0 = node0;
    RSS(ref_collapse_edge(ref_grid, node0, node1), "col!");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSB(ref_validation_cell_face_node(ref_grid, node0), "standard topo",
          { printf("node0 %d node1 %d\n", node0, node1); });
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}